

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpathsimplifier.cpp
# Opt level: O1

bool __thiscall
anon_unknown.dwarf_f5080d::PathSimplifier::intersectNodes
          (PathSimplifier *this,
          QDataBuffer<(anonymous_namespace)::PathSimplifier::Element_*> *elements,
          BVHNode *elementNode,BVHNode *treeNode)

{
  uint uVar1;
  Element *e1;
  Element *e2;
  QDataBuffer<QPoint> *this_00;
  QPoint *pQVar2;
  Element *element;
  Element *element_00;
  undefined4 uVar3;
  undefined4 uVar4;
  bool bVar5;
  bool bVar6;
  pair<int,_int> pVar7;
  pair<int,_int> pVar8;
  undefined1 *puVar9;
  Fraction axis;
  QPoint QVar10;
  long in_FS_OFFSET;
  undefined1 local_b8 [32];
  undefined1 *local_98;
  undefined1 *puStack_90;
  undefined1 *local_88;
  undefined1 *puStack_80;
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  while( true ) {
    if (((((treeNode->maximum).xp.m_i <= (elementNode->minimum).xp.m_i) ||
         ((treeNode->maximum).yp.m_i <= (elementNode->minimum).yp.m_i)) ||
        ((elementNode->maximum).xp.m_i <= (treeNode->minimum).xp.m_i)) ||
       ((elementNode->maximum).yp.m_i <= (treeNode->minimum).yp.m_i)) goto LAB_003fcd81;
    e1 = (treeNode->field_3).element;
    if (treeNode->type == Leaf) break;
    bVar5 = intersectNodes(this,elements,elementNode,(BVHNode *)e1);
    if (bVar5) {
      bVar5 = true;
      goto LAB_003fcd83;
    }
    treeNode = treeNode->right;
  }
  e2 = (elementNode->field_3).element;
  uVar1 = *(uint *)&e1->field_0x38;
  if (e1 != e2 && (uVar1 >> 8 & 1) != 0) {
    bVar5 = equalElements(this,e1,e2);
    if (!bVar5) {
      if (((char)uVar1 != '\x01') || (e2->field_0x38 != '\x01')) {
        local_b8._16_8_ = (long)local_b8 + 0x18;
        local_b8._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_48 = &DAT_aaaaaaaaaaaaaaaa;
        local_58 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
        local_68 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
        local_78 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
        local_88 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
        local_98 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
        local_b8._0_8_ = (undefined1 *)0xc;
        local_b8._8_8_ = (undefined1 *)0x0;
        appendSeparatingAxes(this,(QVarLengthArray<QPoint,_12LL> *)local_b8,e2);
        appendSeparatingAxes
                  (this,(QVarLengthArray<QPoint,_12LL> *)local_b8,(treeNode->field_3).element);
        if ((long)local_b8._8_8_ < 1) goto LAB_003fcfbf;
        element = (elementNode->field_3).element;
        element_00 = (treeNode->field_3).element;
        puVar9 = (undefined1 *)local_b8._8_8_;
        axis = (Fraction)local_b8._16_8_;
        goto LAB_003fcf6b;
      }
      this_00 = this->m_points;
      pQVar2 = this_00->buffer;
      local_b8._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_b8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_b8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      intersectionPoint((IntersectionPoint *)local_b8,pQVar2 + e2->indices[0],
                        pQVar2 + e2->indices[1],pQVar2 + e1->indices[0],pQVar2 + e1->indices[1]);
      if (local_b8._20_4_ != 0 && local_b8._8_4_ != 0) {
        uVar3 = local_b8._4_4_;
        QVar10.xp.m_i =
             (local_b8._0_4_ + 1) - (uint)((uint)(local_b8._4_4_ * 2) < (uint)local_b8._8_4_);
        uVar4 = local_b8._16_4_;
        QVar10.yp.m_i =
             (local_b8._12_4_ + 1) - (uint)((uint)(local_b8._16_4_ * 2) < (uint)local_b8._20_4_);
        QDataBuffer<QPoint>::reserve(this_00,this_00->siz + 1);
        this_00->buffer[this_00->siz] = QVar10;
        this_00->siz = this_00->siz + 1;
        splitLineAt(this,elements,treeNode,(int)this->m_points->siz - 1,uVar3 != 0 || uVar4 != 0);
        bVar5 = splitLineAt(this,elements,elementNode,(int)this->m_points->siz - 1,false);
        goto LAB_003fcd83;
      }
    }
  }
LAB_003fcd81:
  bVar5 = false;
  goto LAB_003fcd83;
  while( true ) {
    axis = (Fraction)((long)axis + 8);
    puVar9 = puVar9 + -1;
    if (puVar9 == (undefined1 *)0x0) break;
LAB_003fcf6b:
    pVar7 = calculateSeparatingAxisRange(this,(QPoint *)axis,element);
    pVar8 = calculateSeparatingAxisRange(this,(QPoint *)axis,element_00);
    bVar5 = false;
    if ((pVar8.second <= pVar7.first) || (bVar5 = false, pVar7.second <= pVar8.first))
    goto LAB_003fd026;
  }
LAB_003fcfbf:
  if ((e1->field_0x38 & 0xfe) != 0) {
    splitCurve(this,elements,treeNode);
  }
  if ((e2->field_0x38 & 0xfe) == 0) {
    bVar6 = intersectNodes(this,elements,elementNode,(BVHNode *)(treeNode->field_3).element);
    bVar5 = true;
    if (!bVar6) {
      bVar5 = intersectNodes(this,elements,elementNode,treeNode->right);
    }
  }
  else {
    splitCurve(this,elements,elementNode);
    bVar5 = true;
  }
LAB_003fd026:
  if (local_b8._16_8_ != (long)local_b8 + 0x18) {
    QtPrivate::sizedFree((void *)local_b8._16_8_,local_b8._0_8_ << 3);
  }
LAB_003fcd83:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar5;
  }
  __stack_chk_fail();
}

Assistant:

bool PathSimplifier::intersectNodes(QDataBuffer<Element *> &elements, BVHNode *elementNode,
                                    BVHNode *treeNode)
{
    if (elementNode->minimum.x() >= treeNode->maximum.x()
        || elementNode->minimum.y() >= treeNode->maximum.y()
        || elementNode->maximum.x() <= treeNode->minimum.x()
        || elementNode->maximum.y() <= treeNode->minimum.y())
    {
        return false;
    }

    Q_ASSERT(elementNode->type == BVHNode::Leaf);
    Element *element = elementNode->element;
    Q_ASSERT(!element->processed);

    if (treeNode->type == BVHNode::Leaf) {
        Element *nodeElement = treeNode->element;
        if (!nodeElement->processed)
            return false;

        if (treeNode->element == elementNode->element)
            return false;

        if (equalElements(treeNode->element, elementNode->element))
            return false; // element doesn't split itself.

        if (element->degree == Element::Line && nodeElement->degree == Element::Line) {
            const QPoint &u1 = m_points->at(element->indices[0]);
            const QPoint &u2 = m_points->at(element->indices[1]);
            const QPoint &v1 = m_points->at(nodeElement->indices[0]);
            const QPoint &v2 = m_points->at(nodeElement->indices[1]);
            IntersectionPoint intersection = intersectionPoint(u1, u2, v1, v2);
            if (!intersection.isValid())
                return false;

            Q_ASSERT(intersection.x.integer >= qMin(u1.x(), u2.x()));
            Q_ASSERT(intersection.y.integer >= qMin(u1.y(), u2.y()));
            Q_ASSERT(intersection.x.integer >= qMin(v1.x(), v2.x()));
            Q_ASSERT(intersection.y.integer >= qMin(v1.y(), v2.y()));

            Q_ASSERT(intersection.x.integer <= qMax(u1.x(), u2.x()));
            Q_ASSERT(intersection.y.integer <= qMax(u1.y(), u2.y()));
            Q_ASSERT(intersection.x.integer <= qMax(v1.x(), v2.x()));
            Q_ASSERT(intersection.y.integer <= qMax(v1.y(), v2.y()));

            m_points->add(intersection.round());
            splitLineAt(elements, treeNode, m_points->size() - 1, !intersection.isAccurate());
            return splitLineAt(elements, elementNode, m_points->size() - 1, false);
        } else {
            QVarLengthArray<QPoint, 12> axes;
            appendSeparatingAxes(axes, elementNode->element);
            appendSeparatingAxes(axes, treeNode->element);
            for (int i = 0; i < axes.size(); ++i) {
                std::pair<int, int> range1 = calculateSeparatingAxisRange(axes.at(i), elementNode->element);
                std::pair<int, int> range2 = calculateSeparatingAxisRange(axes.at(i), treeNode->element);
                if (range1.first >= range2.second || range1.second <= range2.first) {
                    return false; // Separating axis found.
                }
            }
            // Bounding areas overlap.
            if (nodeElement->degree > Element::Line)
                splitCurve(elements, treeNode);
            if (element->degree > Element::Line) {
                splitCurve(elements, elementNode);
            } else {
                // The element was not split, so it can be processed further.
                if (intersectNodes(elements, elementNode, treeNode->left))
                    return true;
                if (intersectNodes(elements, elementNode, treeNode->right))
                    return true;
                return false;
            }
            return true;
        }
    } else {
        if (intersectNodes(elements, elementNode, treeNode->left))
            return true;
        if (intersectNodes(elements, elementNode, treeNode->right))
            return true;
        return false;
    }
}